

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseInstr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  ExprList *pEVar6;
  Enum EVar7;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  _Head_base<0UL,_wabt::Expr_*,_false> local_20;
  
  TVar4 = Peek(this,0);
  if ((TVar4 - AtomicLoad < 0x3e) &&
     ((0x37ff7effbd9fbf7fU >> ((ulong)(TVar4 - AtomicLoad) & 0x3f) & 1) != 0)) {
    local_20._M_head_impl = (Expr *)0x0;
    RVar5 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_20);
  }
  else {
    TVar4 = Peek(this,0);
    if ((0x34 < TVar4 - Block) || ((0x10000000840001U >> ((ulong)(TVar4 - Block) & 0x3f) & 1) == 0))
    {
      bVar3 = PeekMatchExpr(this);
      if (bVar3) {
        RVar5 = ParseExpr(this,exprs);
        return (Result)RVar5.enum_;
      }
      __assert_fail("!\"ParseInstr should only be called when IsInstr() is true\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                    ,0x67a,"Result wabt::WastParser::ParseInstr(ExprList *)");
    }
    local_20._M_head_impl = (Expr *)0x0;
    RVar5 = ParseBlockInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_20);
  }
  _Var2._M_head_impl = local_20._M_head_impl;
  EVar7 = Error;
  if (RVar5.enum_ != Error) {
    local_20._M_head_impl = (Expr *)0x0;
    if ((((_Var2._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       (((_Var2._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar1 = exprs->last_;
    pEVar6 = exprs;
    if (pEVar1 != (Expr *)0x0) {
      ((_Var2._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
      pEVar6 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = _Var2._M_head_impl;
    exprs->last_ = _Var2._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    EVar7 = Ok;
  }
  if (local_20._M_head_impl != (Expr *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseInstr(ExprList* exprs) {
  WABT_TRACE(ParseInstr);
  if (IsPlainInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (IsBlockInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParseBlockInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (PeekMatchExpr()) {
    return ParseExpr(exprs);
  } else {
    assert(!"ParseInstr should only be called when IsInstr() is true");
    return Result::Error;
  }
}